

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O0

ares_status_t ares_uri_set_host(ares_uri_t *uri,char *host)

{
  ares_bool_t aVar1;
  size_t sVar2;
  void *pvVar3;
  char local_188 [8];
  char ipaddr [46];
  char *local_150;
  char *ll_scope;
  char hoststr [256];
  size_t local_40;
  size_t addrlen;
  undefined1 auStack_30 [4];
  ares_addr addr;
  char *host_local;
  ares_uri_t *uri_local;
  
  if (((uri == (ares_uri_t *)0x0) || (addr.addr._8_8_ = host, sVar2 = ares_strlen(host), sVar2 == 0)
      ) || (sVar2 = ares_strlen((char *)addr.addr._8_8_), 0xff < sVar2)) {
    uri_local._4_4_ = ARES_EFORMERR;
  }
  else {
    ares_strcpy((char *)&ll_scope,(char *)addr.addr._8_8_,0x100);
    local_150 = strchr((char *)&ll_scope,0x25);
    if (local_150 != (char *)0x0) {
      *local_150 = '\0';
      local_150 = local_150 + 1;
      aVar1 = ares_str_isalnum(local_150);
      if (aVar1 == ARES_FALSE) {
        return ARES_EBADNAME;
      }
    }
    memset((void *)((long)&addrlen + 4),0,0x14);
    addrlen._4_4_ = 0;
    pvVar3 = ares_dns_pton((char *)&ll_scope,(ares_addr *)((long)&addrlen + 4),&local_40);
    if (pvVar3 == (void *)0x0) {
      aVar1 = ares_is_hostname((char *)addr.addr._8_8_);
      if (aVar1 == ARES_FALSE) {
        uri_local._4_4_ = ARES_EBADNAME;
      }
      else {
        ares_strcpy(uri->host,(char *)addr.addr._8_8_,0x100);
        uri_local._4_4_ = ARES_SUCCESS;
      }
    }
    else {
      ares_inet_ntop(addrlen._4_4_,auStack_30,local_188,0x2e);
      if ((local_150 == (char *)0x0) || (addrlen._4_4_ == 10)) {
        if (local_150 == (char *)0x0) {
          ares_strcpy(uri->host,local_188,0x100);
        }
        else {
          snprintf(uri->host,0x100,"%s%%%s",local_188,local_150);
        }
        uri_local._4_4_ = ARES_SUCCESS;
      }
      else {
        uri_local._4_4_ = ARES_EBADNAME;
      }
    }
  }
  return uri_local._4_4_;
}

Assistant:

ares_status_t ares_uri_set_host(ares_uri_t *uri, const char *host)
{
  struct ares_addr addr;
  size_t           addrlen;
  char             hoststr[256];
  char            *ll_scope;

  if (uri == NULL || ares_strlen(host) == 0 ||
      ares_strlen(host) >= sizeof(hoststr)) {
    return ARES_EFORMERR;
  }

  ares_strcpy(hoststr, host, sizeof(hoststr));

  /* Look for '%' which could be a link-local scope for ipv6 addresses and
   * parse it off */
  ll_scope = strchr(hoststr, '%');
  if (ll_scope != NULL) {
    *ll_scope = 0;
    ll_scope++;
    if (!ares_str_isalnum(ll_scope)) {
      return ARES_EBADNAME;
    }
  }

  /* If its an IP address, normalize it */
  memset(&addr, 0, sizeof(addr));
  addr.family = AF_UNSPEC;
  if (ares_dns_pton(hoststr, &addr, &addrlen) != NULL) {
    char ipaddr[INET6_ADDRSTRLEN];
    ares_inet_ntop(addr.family, &addr.addr, ipaddr, sizeof(ipaddr));
    /* Only IPv6 is allowed to have a scope */
    if (ll_scope != NULL && addr.family != AF_INET6) {
      return ARES_EBADNAME;
    }

    if (ll_scope != NULL) {
      snprintf(uri->host, sizeof(uri->host), "%s%%%s", ipaddr, ll_scope);
    } else {
      ares_strcpy(uri->host, ipaddr, sizeof(uri->host));
    }
    return ARES_SUCCESS;
  }

  /* If its a hostname, make sure its a valid charset */
  if (!ares_is_hostname(host)) {
    return ARES_EBADNAME;
  }

  ares_strcpy(uri->host, host, sizeof(uri->host));
  return ARES_SUCCESS;
}